

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

int multissl_init(Curl_ssl *backend)

{
  Curl_ssl **ppCVar1;
  int iVar2;
  char *first;
  Curl_ssl *pCVar3;
  Curl_ssl **ppCVar4;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    if (backend != (Curl_ssl *)0x0) {
      Curl_ssl = backend;
      return 0;
    }
    if (available_backends[0] != (Curl_ssl *)0x0) {
      first = curl_getenv("CURL_SSL_BACKEND");
      pCVar3 = available_backends[0];
      if (first != (char *)0x0) {
        ppCVar1 = available_backends;
        do {
          ppCVar4 = ppCVar1;
          pCVar3 = available_backends[0];
          if (*ppCVar4 == (Curl_ssl *)0x0) goto LAB_001497d3;
          iVar2 = Curl_strcasecompare(first,((*ppCVar4)->info).name);
          ppCVar1 = ppCVar4 + 1;
        } while (iVar2 == 0);
        pCVar3 = *ppCVar4;
      }
LAB_001497d3:
      Curl_ssl = pCVar3;
      curl_free(first);
      return 0;
    }
  }
  return 1;
}

Assistant:

static int multissl_init(const struct Curl_ssl *backend)
{
  const char *env;
  char *env_tmp;

  if(Curl_ssl != &Curl_ssl_multi)
    return 1;

  if(backend) {
    Curl_ssl = backend;
    return 0;
  }

  if(!available_backends[0])
    return 1;

  env = env_tmp = curl_getenv("CURL_SSL_BACKEND");
#ifdef CURL_DEFAULT_SSL_BACKEND
  if(!env)
    env = CURL_DEFAULT_SSL_BACKEND;
#endif
  if(env) {
    int i;
    for(i = 0; available_backends[i]; i++) {
      if(strcasecompare(env, available_backends[i]->info.name)) {
        Curl_ssl = available_backends[i];
        curl_free(env_tmp);
        return 0;
      }
    }
  }

  /* Fall back to first available backend */
  Curl_ssl = available_backends[0];
  curl_free(env_tmp);
  return 0;
}